

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

UnionInvalidReason
duckdb::UnionVector::CheckUnionValidity(Vector *vector_p,idx_t count,SelectionVector *sel_p)

{
  sel_t *psVar1;
  unsigned_long *puVar2;
  idx_t iVar3;
  VectorBuffer *pVVar4;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference this_00;
  reference pvVar5;
  ulong uVar6;
  bool bVar7;
  UnionInvalidReason UVar8;
  type unaff_RBP;
  size_type __n;
  ulong uVar9;
  size_type __n_00;
  char cVar10;
  bool bVar11;
  SelectionVector owned_sel;
  vector<duckdb::UnifiedVectorFormat,_true> child_vdata;
  UnifiedVectorFormat vector_vdata;
  allocator_type local_e9;
  SelectionVector *local_e8;
  idx_t local_e0;
  buffer_ptr<SelectionData> local_d8;
  SelectionVector local_c8;
  reference local_a8;
  ulong local_a0;
  ulong local_98;
  vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_> local_90;
  UnifiedVectorFormat local_78;
  
  local_c8.sel_vector = (sel_t *)0x0;
  local_c8.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_c8.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (vector_p->vector_type == CONSTANT_VECTOR) {
    local_e8 = ConstantVector::ZeroSelectionVector(count,&local_c8);
  }
  else {
    local_e8 = sel_p;
    if (vector_p->vector_type == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(vector_p);
      shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector_p->auxiliary);
      DictionaryVector::VerifyDictionary(vector_p);
      pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector_p->buffer);
      SelectionVector::Slice
                ((SelectionVector *)&local_78,(SelectionVector *)(pVVar4 + 1),(idx_t)sel_p);
      local_d8.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)local_78.sel;
      local_d8.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_78.data + 8) =
               *(_Atomic_word *)((long)local_78.data + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_78.data + 8) =
               *(_Atomic_word *)((long)local_78.data + 8) + 1;
        }
      }
      local_e8 = &local_c8;
      SelectionVector::Initialize(local_e8,&local_d8);
      if (local_d8.internal.super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
    }
  }
  local_e0 = UnionType::GetMemberCount(&vector_p->type);
  if (local_e0 == 0) {
    UVar8 = NO_MEMBERS;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector_p,count,&local_78);
    this = StructVector::GetEntries(vector_p);
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
              (&local_90,
               (long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_e9);
    if ((this->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->
        super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::operator[](this,__n);
        unaff_RBP = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_00);
        pvVar5 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                           ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_90,__n);
        Vector::ToUnifiedFormat(unaff_RBP,count,pvVar5);
        __n = __n + 1;
      } while (__n < (ulong)((long)(this->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->
                                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ).
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pvVar5 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                       ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_90,0);
    iVar3 = local_e0;
    if (count != 0) {
      uVar9 = 0;
      local_a8 = pvVar5;
      local_a0 = count;
      do {
        uVar6 = uVar9;
        if (local_e8->sel_vector != (sel_t *)0x0) {
          uVar6 = (ulong)local_e8->sel_vector[uVar9];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar6 >> 6]
             >> (uVar6 & 0x3f) & 1) != 0)) {
          uVar6 = uVar9;
          if (sel_p->sel_vector != (sel_t *)0x0) {
            uVar6 = (ulong)sel_p->sel_vector[uVar9];
          }
          psVar1 = pvVar5->sel->sel_vector;
          if (psVar1 != (sel_t *)0x0) {
            uVar6 = (ulong)psVar1[uVar6];
          }
          puVar2 = (pvVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0))
          {
            if (pvVar5->data[uVar6] < local_e0) {
              local_98 = (ulong)(byte)-pvVar5->data[uVar6];
              bVar7 = false;
              __n_00 = 1;
              do {
                pvVar5 = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                                   ((vector<duckdb::UnifiedVectorFormat,_true> *)&local_90,__n_00);
                uVar6 = uVar9;
                if (sel_p->sel_vector != (sel_t *)0x0) {
                  uVar6 = (ulong)sel_p->sel_vector[uVar9];
                }
                psVar1 = pvVar5->sel->sel_vector;
                if (psVar1 != (sel_t *)0x0) {
                  uVar6 = (ulong)psVar1[uVar6];
                }
                puVar2 = (pvVar5->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                if ((puVar2 == (unsigned_long *)0x0) ||
                   ((puVar2[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) {
                  if (bVar7) {
                    unaff_RBP = (type)0x3;
                    cVar10 = '\x01';
                  }
                  else {
                    cVar10 = (char)((char)local_98 + (char)__n_00) != '\x01';
                    unaff_RBP = (type)((ulong)unaff_RBP & 0xff);
                    if ((bool)cVar10) {
                      unaff_RBP = (type)0x4;
                    }
                    bVar7 = true;
                  }
                }
                else {
                  cVar10 = '\n';
                }
                if ((cVar10 != '\n') && (cVar10 != '\0')) goto LAB_002f0a7c;
                bVar11 = __n_00 != iVar3;
                __n_00 = __n_00 + 1;
              } while (bVar11);
              cVar10 = '\b';
LAB_002f0a7c:
              pvVar5 = local_a8;
              if (cVar10 == '\b') {
                cVar10 = '\0';
              }
              goto LAB_002f0aa5;
            }
            unaff_RBP = (type)&DAT_00000001;
          }
          else {
            unaff_RBP = (type)0x5;
          }
          cVar10 = '\x01';
        }
        else {
          cVar10 = '\a';
        }
LAB_002f0aa5:
        UVar8 = (UnionInvalidReason)unaff_RBP;
        if ((cVar10 != '\a') && (cVar10 != '\0')) goto LAB_002f0abe;
        uVar9 = uVar9 + 1;
      } while (uVar9 != local_a0);
    }
    UVar8 = VALID;
LAB_002f0abe:
    ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::
    ~vector(&local_90);
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_c8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return UVar8;
}

Assistant:

UnionInvalidReason UnionVector::CheckUnionValidity(Vector &vector_p, idx_t count, const SelectionVector &sel_p) {
	D_ASSERT(vector_p.GetType().id() == LogicalTypeId::UNION);

	// Will contain the (possibly) merged selection vector
	const SelectionVector *sel = &sel_p;
	SelectionVector owned_sel;
	Vector *vector = &vector_p;
	if (vector->GetVectorType() == VectorType::DICTIONARY_VECTOR) {
		// In the case of a dictionary vector, unwrap the Vector, and merge the selection vectors.
		auto &child = DictionaryVector::Child(*vector);
		D_ASSERT(child.GetVectorType() != VectorType::DICTIONARY_VECTOR);
		auto &dict_sel = DictionaryVector::SelVector(*vector);
		// merge the selection vectors and verify the child
		auto new_buffer = dict_sel.Slice(*sel, count);
		owned_sel.Initialize(new_buffer);
		sel = &owned_sel;
		vector = &child;
	} else if (vector->GetVectorType() == VectorType::CONSTANT_VECTOR) {
		sel = ConstantVector::ZeroSelectionVector(count, owned_sel);
	}

	auto member_count = UnionType::GetMemberCount(vector_p.GetType());
	if (member_count == 0) {
		return UnionInvalidReason::NO_MEMBERS;
	}

	UnifiedVectorFormat vector_vdata;
	vector_p.ToUnifiedFormat(count, vector_vdata);

	auto &entries = StructVector::GetEntries(vector_p);
	duckdb::vector<UnifiedVectorFormat> child_vdata(entries.size());
	for (idx_t entry_idx = 0; entry_idx < entries.size(); entry_idx++) {
		auto &child = *entries[entry_idx];
		child.ToUnifiedFormat(count, child_vdata[entry_idx]);
	}

	auto &tag_vdata = child_vdata[0];

	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto mapped_idx = sel->get_index(row_idx);

		if (!vector_vdata.validity.RowIsValid(mapped_idx)) {
			continue;
		}

		auto tag_idx = tag_vdata.sel->get_index(sel_p.get_index(row_idx));
		if (!tag_vdata.validity.RowIsValid(tag_idx)) {
			// we can't have NULL tags!
			return UnionInvalidReason::NULL_TAG;
		}
		auto tag = UnifiedVectorFormat::GetData<union_tag_t>(tag_vdata)[tag_idx];
		if (tag >= member_count) {
			return UnionInvalidReason::TAG_OUT_OF_RANGE;
		}

		bool found_valid = false;
		for (idx_t i = 0; i < member_count; i++) {
			auto &member_vdata = child_vdata[1 + i]; // skip the tag
			idx_t member_idx = member_vdata.sel->get_index(sel_p.get_index(row_idx));
			if (!member_vdata.validity.RowIsValid(member_idx)) {
				continue;
			}
			if (found_valid) {
				return UnionInvalidReason::VALIDITY_OVERLAP;
			}
			found_valid = true;
			if (tag != static_cast<union_tag_t>(i)) {
				return UnionInvalidReason::TAG_MISMATCH;
			}
		}
	}

	return UnionInvalidReason::VALID;
}